

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  int iVar4;
  uint uVar5;
  lys_node *plVar6;
  lys_node *plVar7;
  ly_set *set;
  lys_node_list *plVar8;
  lys_module *module;
  lys_node *plVar9;
  lyd_node *plVar10;
  lyd_node *plVar11;
  lyd_node **pplVar12;
  lyd_node *plVar13;
  int permanent;
  lys_node_leaf *node_00;
  lyd_node *plVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  LYS_NODE LVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte local_41;
  lyd_node *plStack_40;
  uint8_t pos;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x10df,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar2 = *sibling;
    do {
      plStack_40 = plVar2;
      plVar2 = plStack_40->prev;
    } while (plStack_40->prev->next != (lyd_node *)0x0);
  }
  else {
    plStack_40 = parent->child;
    plVar6 = parent->schema;
    if (plStack_40 == (lyd_node *)0x0) {
      LVar18 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
        LVar18 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      }
      goto LAB_0016993a;
    }
    LVar18 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_0016993a;
  }
  plVar6 = lys_parent(plStack_40->schema);
  for (; LVar18 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER, plVar6 != (lys_node *)0x0;
      plVar6 = lys_parent(plVar6)) {
    if ((plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN)
    goto LAB_0016993a;
  }
  plVar6 = (lys_node *)0x0;
LAB_0016993a:
  plVar7 = lys_parent(node->schema);
  if (plVar7 == (lys_node *)0x0) {
    bVar20 = true;
  }
  else {
    do {
      bVar20 = (plVar7->nodetype & LVar18) == LYS_UNKNOWN;
      if (!bVar20) goto LAB_0016996a;
      plVar7 = lys_parent(plVar7);
    } while (plVar7 != (lys_node *)0x0);
  }
  plVar7 = (lys_node *)0x0;
LAB_0016996a:
  if (plVar6 != plVar7) {
    pcVar17 = "<top-lvl>";
    pcVar16 = "<top-lvl>";
    if (plVar6 != (lys_node *)0x0) {
      pcVar16 = plVar6->name;
    }
    if (!bVar20) {
      pcVar17 = plVar7->name;
    }
    ly_log(parent->schema->module->ctx,LY_LLERR,LY_EINVAL,
           "Cannot insert, different parents (\"%s\" and \"%s\").",pcVar16,pcVar17);
    return 1;
  }
  local_31 = '\x01';
  permanent = 0;
  if ((invalidate != 0) &&
     ((iVar4 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
      (iVar4 != 0 || node->parent != parent)))) {
    permanent = iVar4 + 1;
    local_31 = iVar4 == 0;
  }
  if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
    lyd_unlink_internal(node,permanent);
  }
  set = ly_set_new();
  pplVar1 = &parent->child;
  bVar20 = false;
LAB_00169a2f:
  plVar2 = node->next;
  if ((permanent == 1) &&
     (iVar4 = lyv_multicases(node,(lys_node *)0x0,&stack0xffffffffffffffc0,1,(lyd_node *)0x0),
     iVar4 != 0)) {
    ly_set_free(set);
    return 1;
  }
  node->prev = node;
  node->next = (lyd_node *)0x0;
  bVar21 = (node->field_0x9 & 1) != 0;
  if (!bVar21) {
    bVar20 = true;
  }
  node_00 = (lys_node_leaf *)node->schema;
  if ((bVar21) || (node_00->nodetype != LYS_LEAF)) {
LAB_00169afd:
    LVar18 = node_00->nodetype;
    plVar11 = plStack_40;
    if (LVar18 != LYS_CONTAINER) {
      if (LVar18 != LYS_LEAF) {
        if ((LVar18 == LYS_LEAFLIST) &&
           ((uVar15 = set->number, uVar5 = ly_set_add(set,node_00,0), uVar5 != uVar15 ||
            ((node->field_0x9 & 1) != 0)))) {
          plVar11 = plStack_40;
          if (plStack_40 == (lyd_node *)0x0) goto LAB_00169c17;
          do {
            plVar10 = plVar11->next;
            if (plVar11->schema == node->schema) {
              if ((node->field_0x9 & 1) == 0) {
                if ((plVar11->field_0x9 & 1) != 0) {
LAB_00169b70:
                  if (plVar11 == plStack_40) {
                    plStack_40 = plVar10;
                  }
                  lyd_free_internal_r(plVar11,1);
                }
              }
              else if (((plVar11->field_0x9 & 1) == 0) ||
                      (((plVar11->schema->flags & 1) != 0 &&
                       (iVar4 = strcmp((char *)plVar11->ht,(char *)node->ht), iVar4 == 0))))
              goto LAB_00169b70;
            }
            plVar11 = plVar10;
          } while (plVar10 != (lyd_node *)0x0);
        }
        goto LAB_00169bf6;
      }
      if (plStack_40 != (lyd_node *)0x0) goto LAB_00169bcc;
LAB_00169c17:
      plStack_40 = node;
      if (parent != (lyd_node *)0x0) {
        *pplVar1 = node;
      }
      goto LAB_00169e4a;
    }
    if (plStack_40 != (lyd_node *)0x0 && (node_00->type).ext == (lys_ext_instance **)0x0) {
LAB_00169bcc:
      if ((lys_node_leaf *)plVar11->schema != node_00) goto code_r0x00169bd1;
      if (((node->field_0x9 & 1) != 0) || ((plVar11->field_0x9 & 1) != 0)) {
        plVar10 = node;
        if ((node->parent == (lyd_node *)0x0) && (node->prev->next == (lyd_node *)0x0)) {
          if (node->next != (lyd_node *)0x0) {
            plVar3 = plVar11->parent;
            plVar13 = node->next;
            plVar14 = node;
            do {
              plVar10 = plVar13;
              plVar14->parent = plVar3;
              plVar13 = plVar10->next;
              plVar14 = plVar10;
            } while (plVar10->next != (lyd_node *)0x0);
          }
        }
        else {
          node->next = (lyd_node *)0x0;
          node->prev = node;
        }
        plVar3 = plVar11->parent;
        if (plVar3 != (lyd_node *)0x0) {
          if (plVar3->child == plVar11) {
            plVar3->child = node;
          }
          plVar11->parent = (lyd_node *)0x0;
        }
        plVar3 = plVar11->prev;
        if (plVar3 != plVar11) {
          if (plVar3->next != (lyd_node *)0x0) {
            plVar3->next = node;
          }
          node->prev = plVar3;
          plVar11->prev = plVar11;
          plVar3 = plVar11->next;
          if (plVar3 == (lyd_node *)0x0) {
            plVar3 = node;
            if (node->parent == (lyd_node *)0x0) {
              do {
                plVar13 = plVar3;
                plVar3 = plVar13->prev;
              } while (plVar3 != plVar11);
              plVar13->prev = plVar10;
            }
            else {
              node->parent->child->prev = plVar10;
            }
          }
          else {
            plVar3->prev = plVar10;
            plVar10->next = plVar3;
            plVar11->next = (lyd_node *)0x0;
          }
        }
        lyd_free_internal_r(plVar11,1);
        goto LAB_00169e4a;
      }
    }
LAB_00169bf6:
    if (plStack_40 == (lyd_node *)0x0) goto LAB_00169c17;
    if (local_31 != '\0') {
      plVar11 = plStack_40->prev;
      plVar11->next = node;
      node->prev = plVar11;
      plStack_40->prev = node;
      goto LAB_00169e4a;
    }
    plVar6 = node->schema->parent;
    if ((plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
      do {
        plVar6 = lys_parent(plVar6);
      } while ((plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN);
      if (plStack_40 != (lyd_node *)0x0) goto LAB_00169c66;
    }
    else {
LAB_00169c66:
      plVar7 = (lys_node *)0x0;
      plVar11 = plStack_40;
LAB_00169c69:
      do {
        module = lys_node_module(plVar6);
        plVar7 = lys_getnext(plVar7,plVar6,module,0);
        if (plVar7 == (lys_node *)0x0) {
          plVar9 = node->schema;
        }
        else {
          plVar9 = node->schema;
          if ((plVar11->schema != plVar7) && (plVar9 != plVar7)) goto LAB_00169c69;
        }
        if (plVar9 == plVar7) {
          if (((plVar7->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (plVar11->schema != plVar9)) goto LAB_00169d92;
          goto LAB_00169ced;
        }
        plVar11 = plVar11->next;
      } while (plVar11 != (lyd_node *)0x0);
    }
    goto LAB_00169cab;
  }
  plVar8 = lys_is_key(node_00,&local_41);
  if (plVar8 == (lys_node_list *)0x0) {
    node_00 = (lys_node_leaf *)node->schema;
    goto LAB_00169afd;
  }
  plVar11 = *pplVar1;
  bVar21 = plVar11 != (lyd_node *)0x0;
  plVar10 = plVar11;
  if (local_41 != 0 && bVar21) {
    uVar15 = 1;
    do {
      if (plVar10->schema->nodetype != LYS_LEAF) goto LAB_00169dad;
      plVar10 = plVar10->next;
      bVar21 = plVar10 != (lyd_node *)0x0;
    } while ((bVar21) && (bVar19 = uVar15 < local_41, uVar15 = uVar15 + 1, bVar19));
  }
  if (!bVar21) goto LAB_00169bf6;
LAB_00169dad:
  if (plVar11 == plVar10) {
    *pplVar1 = node;
    plVar11 = node;
  }
  plVar3 = plVar10->prev;
  if (plVar3->next != (lyd_node *)0x0) {
    plVar3->next = node;
  }
  node->prev = plVar3;
  plVar10->prev = node;
  node->next = plVar10;
  if (plVar11 != plStack_40) {
    plStack_40 = plVar11;
  }
  goto LAB_00169e4a;
code_r0x00169bd1:
  pplVar12 = &plVar11->next;
  plVar11 = *pplVar12;
  if (*pplVar12 == (lyd_node *)0x0) goto LAB_00169bf6;
  goto LAB_00169bcc;
  while (plVar11 = plVar11->next, plVar11 != (lyd_node *)0x0) {
LAB_00169ced:
    if (plVar11->schema != plVar9) goto LAB_00169d92;
  }
LAB_00169cab:
  plVar11 = plStack_40->prev;
  plVar11->next = node;
  node->prev = plVar11;
  plStack_40->prev = node;
  goto LAB_00169e4a;
LAB_00169d92:
  if (plVar11 == plStack_40) {
    pplVar12 = pplVar1;
    plStack_40 = node;
    if (parent != (lyd_node *)0x0) goto LAB_00169dfc;
  }
  else {
    pplVar12 = &plVar11->prev->next;
LAB_00169dfc:
    *pplVar12 = node;
  }
  node->prev = plVar11->prev;
  plVar11->prev = node;
  node->next = plVar11;
LAB_00169e4a:
  _lyd_unlink_hash(node,node->parent,1);
  node->parent = parent;
  _lyd_insert_hash(node,1);
  if (invalidate != 0) {
    check_leaf_list_backlinks(node,0);
  }
  if (permanent != 0) {
    lyd_insert_setinvalid(node);
  }
  node = plVar2;
  if (plVar2 == (lyd_node *)0x0) goto LAB_00169ece;
  goto LAB_00169a2f;
LAB_00169ece:
  ly_set_free(set);
  if (parent != (lyd_node *)0x0 && bVar20) {
    do {
      if ((parent->field_0x9 & 1) == 0) break;
      parent->field_0x9 = parent->field_0x9 & 0xfe;
      parent = parent->parent;
    } while (parent != (lyd_node *)0x0);
  }
  if (sibling != (lyd_node **)0x0) {
    *sibling = plStack_40;
    return 0;
  }
  return 0;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int i;
    uint8_t pos;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        LOGERR(parent->schema->module->ctx, LY_EINVAL, "Cannot insert, different parents (\"%s\" and \"%s\").",
               (par1 ? par1->name : "<top-lvl>"), (par2 ? par2->name : "<top-lvl>"));
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && ins->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)ins->schema, &pos)) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < pos && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next);
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }

#ifdef LY_ENABLED_CACHE
        lyd_unlink_hash(ins, ins->parent);
#endif

        ins->parent = parent;

#ifdef LY_ENABLED_CACHE
        lyd_insert_hash(ins);
#endif

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}